

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::Person::Person(Person *this,Person *from)

{
  bool bVar1;
  undefined1 *this_00;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  string *psVar3;
  string *psVar4;
  Arena *pAVar5;
  Person *from_local;
  Person *this_local;
  UnknownFieldSet *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  *(undefined ***)this = &PTR__Person_0011cb88;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::RepeatedPtrField
            (&this->phones_,&from->phones_);
  this_00 = &from->field_0x8;
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_00);
      local_28 = &pCVar2->unknown_fields;
    }
    else {
      local_28 = (UnknownFieldSet *)(*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,local_28);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar3);
  bVar1 = _internal_has_name(from);
  if (bVar1) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    psVar4 = _internal_name_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    google::protobuf::internal::ArenaStringPtr::Set(&this->name_,psVar3,psVar4,pAVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->email_,psVar3);
  bVar1 = _internal_has_email(from);
  if (bVar1) {
    psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    psVar4 = _internal_email_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    google::protobuf::internal::ArenaStringPtr::Set(&this->email_,psVar3,psVar4,pAVar5);
  }
  this->id_ = from->id_;
  return;
}

Assistant:

Person::Person(const Person& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      phones_(from.phones_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  email_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_email()) {
    email_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_email(),
      GetArena());
  }
  id_ = from.id_;
  // @@protoc_insertion_point(copy_constructor:Messages.Person)
}